

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O0

bool __thiscall
iDynTree::InverseKinematics::addFrameConstraint
          (InverseKinematics *this,string *frameName,MatrixView<const_double> *constraintValue)

{
  index_type iVar1;
  MatrixView<const_double> *in_RDX;
  MatrixView<const_double> *in_RSI;
  bool ok;
  int expected_transform_rows;
  int expected_transform_cols;
  MatrixView<const_double> *this_00;
  bool local_141;
  MatrixView<const_double> *in_stack_fffffffffffffec8;
  MatrixFixSize<4U,_4U> *in_stack_fffffffffffffed0;
  MatrixFixSize local_110 [128];
  Transform local_90 [103];
  bool local_29;
  undefined4 local_28;
  undefined4 local_24;
  MatrixView<const_double> *local_18;
  bool local_1;
  
  local_24 = 4;
  local_28 = 4;
  this_00 = in_RDX;
  local_18 = in_RSI;
  iVar1 = MatrixView<const_double>::rows(in_RDX);
  local_141 = false;
  if (iVar1 == 4) {
    iVar1 = MatrixView<const_double>::cols(in_RDX);
    local_141 = iVar1 == 4;
  }
  local_29 = local_141;
  if (local_141 == false) {
    iDynTree::reportError
              ("InverseKinematics","addFrameConstraint","Wrong size in input constraintValue");
    local_1 = false;
  }
  else {
    MatrixView<const_double>::MatrixView(this_00,local_18);
    MatrixFixSize<4U,_4U>::MatrixFixSize(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    iDynTree::Transform::Transform(local_90,local_110);
    local_1 = addFrameConstraint((InverseKinematics *)this_00,(string *)local_18,
                                 (Transform *)0x16a1ba);
  }
  return local_1;
}

Assistant:

bool InverseKinematics::addFrameConstraint(const std::string &frameName,
                                               iDynTree::MatrixView<const double> constraintValue)
    {
        constexpr int expected_transform_cols = 4;
        constexpr int expected_transform_rows = 4;
        bool ok = (constraintValue.rows() == expected_transform_rows)
            && (constraintValue.cols() == expected_transform_cols);
        if( !ok )
        {
            reportError("InverseKinematics","addFrameConstraint","Wrong size in input constraintValue");
            return false;
        }

        return this->addFrameConstraint(frameName, Transform(constraintValue));
    }